

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_blind_nonce_list,BlindFactor *asset_blind_factor,BlindFactor *entropy)

{
  ByteData256 *__x;
  ByteData *this_00;
  ByteData256 *this_01;
  pointer pAVar1;
  pointer pAVar2;
  Amount *pAVar3;
  Script *pSVar4;
  pointer pCVar5;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  _func_int **entropy_00;
  uint32_t tx_in_index_00;
  int iVar6;
  value_type_conflict *__val;
  pointer __dest;
  size_t sVar7;
  pointer puVar8;
  int64_t iVar9;
  CfdException *pCVar10;
  Amount *amount;
  ulong uVar11;
  Amount *amount_00;
  Script *this_02;
  long lVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  ConfidentialNonce nonce;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  ByteData local_188;
  Amount *local_170;
  Amount total;
  pointer local_158;
  ByteData local_138;
  IssuanceParameter *local_120;
  ConfidentialAssetId *local_118;
  ConfidentialTransaction *local_110;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *local_108;
  uint32_t local_100;
  int ret;
  ConfidentialValue local_f8;
  ByteData256 local_d0;
  ByteData256 local_b8;
  ByteData256 local_a0;
  ConfidentialValue local_88;
  ByteData local_60;
  ByteData local_48;
  
  local_170 = asset_amount;
  local_108 = asset_locking_script_list;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x7c8,"SetAssetReissuance");
  local_110 = this;
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&nonce,
             &(this->vin_).
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[tx_in_index].inflation_keys_);
  puVar8 = (pointer)CONCAT44(nonce.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             nonce.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_);
  local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = (long)nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
  local_100 = tx_in_index;
  if (uVar11 == 0) {
    __dest = (pointer)0x0;
    sVar13 = 0;
  }
  else {
    if ((long)uVar11 < 0) {
      ::std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar11);
    puVar8 = (pointer)CONCAT44(nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
    sVar13 = (long)nonce.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar8;
  }
  local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __dest + uVar11;
  local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,puVar8,sVar13);
  }
  local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + sVar13;
  sVar7 = ByteData::GetDataSize(&local_188);
  bVar16 = true;
  if (sVar7 == 0) {
    ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&total,
               &(local_110->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].issuance_amount_);
    local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar11 = (long)local_158 - total._8_8_;
    if (uVar11 == 0) {
      puVar8 = (pointer)0x0;
      sVar13 = 0;
    }
    else {
      if ((long)uVar11 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar8 = (pointer)operator_new(uVar11);
      sVar13 = (long)local_158 - total._8_8_;
    }
    local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar8 + uVar11;
    local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar8;
    if (local_158 != (pointer)total._8_8_) {
      local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
      memmove(puVar8,(void *)total._8_8_,sVar13);
    }
    local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8 + sVar13;
    sVar7 = ByteData::GetDataSize(&local_138);
    bVar16 = sVar7 != 0;
    if (local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    total.amount_ = (int64_t)&PTR__ConfidentialValue_0068d0c0;
    if (total._8_8_ != 0) {
      operator_delete((void *)total._8_8_);
    }
  }
  if (local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if ((void *)CONCAT44(nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (bVar16) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7cc;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"already set to reissue parameter"
                 );
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"already set to reissue parameter","");
    CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar9 = Amount::GetSatoshiValue(local_170);
  if (iVar9 < 1) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7d2;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                  "ReIssuance must have one non-zero amount.");
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"ReIssuance must have one non-zero amount.","");
    CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pAVar1 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pAVar1 == pAVar2) ==
      ((local_108->super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
       _M_impl.super__Vector_impl_data._M_start ==
      (local_108->super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl
      .super__Vector_impl_data._M_finish)) {
    if (pAVar1 != pAVar2) {
      Amount::Amount(&total);
      amount_00 = (asset_output_amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start;
      pAVar3 = (asset_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (amount_00 != pAVar3) {
        do {
          Amount::operator+=(&total,amount_00);
          amount_00 = amount_00 + 1;
        } while (amount_00 != pAVar3);
      }
      bVar16 = Amount::operator!=(&total,local_170);
      if (bVar16) {
        nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x7e4;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetReissuance";
        logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"Unmatch asset amount.");
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        nonce._vptr_ConfidentialNonce =
             (_func_int **)
             &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&nonce,"Unmatch asset amount.","");
        CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&nonce);
        __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pSVar4 = (local_108->super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = (local_108->
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                     _M_impl.super__Vector_impl_data._M_start; this_02 != pSVar4;
          this_02 = this_02 + 1) {
        bVar16 = Script::IsEmpty(this_02);
        if (bVar16) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7e9;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetReissuance";
          logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                        "Empty locking script from asset.");
          pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
          nonce._vptr_ConfidentialNonce =
               (_func_int **)
               &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&nonce,"Empty locking script from asset.","");
          CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
    }
    total.amount_ = 0;
    total.ignore_check_ = false;
    total._9_7_ = 0;
    total.amount_ = (int64_t)operator_new(0x20);
    total._8_8_ = total.amount_ + 0x20;
    *(undefined8 *)(total.amount_ + 0x10) = 0;
    *(undefined8 *)(total.amount_ + 0x18) = 0;
    *(undefined8 *)total.amount_ = 0;
    *(undefined8 *)(total.amount_ + 8) = 0;
    __x = &entropy->data_;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_188.data_,&__x->data_);
    ByteData256::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce,
               (ByteData256 *)&local_188);
    entropy_00 = nonce._vptr_ConfidentialNonce;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a0.data_,&__x->data_);
    ByteData256::GetBytes(&local_138.data_,&local_a0);
    iVar6 = wally_tx_elements_issuance_calculate_asset
                      ((uchar *)entropy_00,
                       (long)local_138.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_138.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)total.amount_,
                       total._8_8_ - total.amount_);
    if (local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (nonce._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(nonce._vptr_ConfidentialNonce);
    }
    if (local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ret = iVar6;
    if (iVar6 == 0) {
      (__return_storage_ptr__->entropy)._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500
      ;
      this_01 = &(__return_storage_ptr__->entropy).data_;
      ByteData256::ByteData256(this_01);
      (__return_storage_ptr__->asset)._vptr_ConfidentialAssetId =
           (_func_int **)&PTR__ConfidentialAssetId_0068d228;
      this_00 = &(__return_storage_ptr__->asset).data_;
      ByteData::ByteData(this_00);
      local_118 = &__return_storage_ptr__->asset;
      (__return_storage_ptr__->asset).version_ = '\0';
      (__return_storage_ptr__->token)._vptr_ConfidentialAssetId =
           (_func_int **)&PTR__ConfidentialAssetId_0068d228;
      ByteData::ByteData(&(__return_storage_ptr__->token).data_);
      tx_in_index_00 = local_100;
      (__return_storage_ptr__->token).version_ = '\0';
      local_120 = __return_storage_ptr__;
      if (__return_storage_ptr__ != (IssuanceParameter *)entropy) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this_01->data_,&__x->data_);
      }
      ByteData::ByteData(&local_188,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total)
      ;
      ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&nonce,&local_188);
      if (local_118 != (ConfidentialAssetId *)&nonce) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this_00->data_,&nonce.data_.data_);
        (local_120->asset).version_ = nonce.version_;
      }
      nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
      if ((void *)CONCAT44(nonce.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           nonce.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(nonce.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         nonce.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if (local_188.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b8.data_,&(asset_blind_factor->data_).data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_d0.data_,&__x->data_);
      ConfidentialValue::ConfidentialValue(&local_88,local_170);
      local_f8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      ByteData::ByteData(&local_f8.data_);
      local_f8.version_ = '\0';
      ByteData::ByteData(&local_48);
      ByteData::ByteData(&local_60);
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_60;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_48;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)nonce._vptr_ConfidentialNonce;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start._4_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start._0_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      SetIssuance(local_110,tx_in_index_00,&local_b8,&local_d0,&local_88,&local_f8,
                  issuance_amount_rangeproof,inflation_keys_rangeproof);
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_f8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_88._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
      if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar9 = Amount::GetSatoshiValue(local_170);
        if ((0 < iVar9) &&
           ((asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_finish !=
            (asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_start)) {
          lVar12 = 0;
          lVar14 = 0;
          lVar15 = 0;
          uVar11 = 0;
          do {
            nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
            ByteData::ByteData(&nonce.data_);
            nonce.version_ = '\0';
            pCVar5 = (asset_blind_nonce_list->
                     super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((uVar11 < (ulong)(((long)(asset_blind_nonce_list->
                                         super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5
                                  >> 3) * -0x3333333333333333)) &&
               ((ConfidentialNonce *)((long)&pCVar5->_vptr_ConfidentialNonce + lVar15) != &nonce)) {
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&nonce.data_.data_,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(pCVar5->data_).data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar15));
              nonce.version_ = (&pCVar5->version_)[lVar15];
            }
            AddTxOut(local_110,
                     (Amount *)
                     ((long)&((asset_output_amount_list->
                              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                              )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar14),
                     local_118,
                     (Script *)
                     ((long)&((local_108->
                              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar12),
                     &nonce);
            nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
            if ((void *)CONCAT44(nonce.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 nonce.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
              operator_delete((void *)CONCAT44(nonce.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               nonce.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_));
            }
            uVar11 = uVar11 + 1;
            lVar15 = lVar15 + 0x28;
            lVar14 = lVar14 + 0x10;
            lVar12 = lVar12 + 0x38;
          } while (uVar11 < (ulong)((long)(asset_output_amount_list->
                                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(asset_output_amount_list->
                                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      if (total.amount_ != 0) {
        operator_delete((void *)total.amount_);
      }
      return local_120;
    }
    nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7f6;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<int&>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                      "wally_tx_elements_issuance_calculate_asset NG[{}].",&ret);
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&nonce,"asset calculate error.","");
    CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&nonce);
    __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x7d8;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetAssetReissuance";
  logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                "Unmatch count. asset amount list and locking script list.");
  pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
  nonce._vptr_ConfidentialNonce =
       (_func_int **)
       &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,"Unmatch count. asset amount list and locking script list.","");
  CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&nonce);
  __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetReissuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_blind_nonce_list,
    const BlindFactor &asset_blind_factor, const BlindFactor &entropy) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to reissue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to reissue parameter");
  }

  if (asset_amount.GetSatoshiValue() <= 0) {
    warn(CFD_LOG_SOURCE, "ReIssuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "ReIssuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }

  std::vector<uint8_t> asset(kAssetSize);
  int ret = wally_tx_elements_issuance_calculate_asset(
      entropy.GetData().GetBytes().data(), entropy.GetData().GetBytes().size(),
      asset.data(), asset.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_calculate_asset NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "asset calculate error.");
  }

  IssuanceParameter param;
  param.entropy = entropy;
  param.asset = ConfidentialAssetId(ByteData(asset));
  SetIssuance(
      tx_in_index, asset_blind_factor.GetData(), entropy.GetData(),
      ConfidentialValue(asset_amount), ConfidentialValue(), ByteData(),
      ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_blind_nonce_list.size()) {
        nonce = asset_blind_nonce_list[index];
      }
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  return param;
}